

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.hpp
# Opt level: O2

void __thiscall
websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::
handle_post_init(connection<websocketpp::config::asio::transport_config> *this,timer_ptr *post_timer
                ,init_handler *callback,error_code *ec)

{
  basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>
  *pbVar1;
  basic<websocketpp::concurrency::basic,_websocketpp::log::alevel> *this_00;
  duration dVar2;
  error_code *__n;
  __weak_ptr<void,_(__gnu_cxx::_Lock_policy)2> _Stack_48;
  error_code local_38;
  
  __n = ec;
  std::error_code::error_code<websocketpp::transport::error::value,void>
            (&local_38,operation_aborted);
  if ((ec->_M_cat == local_38._M_cat) && (ec->_M_value == local_38._M_value)) {
LAB_001bcde1:
    log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>::write
              ((this->m_alog).
               super___shared_ptr<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr,0x400,"post_init cancelled",(size_t)__n);
  }
  else {
    pbVar1 = (post_timer->
             super___shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>,_(__gnu_cxx::_Lock_policy)2>
             )._M_ptr;
    if (pbVar1 != (basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>
                   *)0x0) {
      dVar2 = ::asio::
              basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>
              ::expires_from_now(pbVar1);
      if (dVar2.__r < 0) goto LAB_001bcde1;
      pbVar1 = (post_timer->
               super___shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>,_(__gnu_cxx::_Lock_policy)2>
               )._M_ptr;
      if (pbVar1 != (basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>
                     *)0x0) {
        ::asio::
        basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>
        ::cancel(pbVar1);
      }
    }
    this_00 = (this->m_alog).
              super___shared_ptr<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    if ((this_00->m_static_channels & 0x400) != 0) {
      log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>::write
                (this_00,0x400,"asio connection handle_post_init",(size_t)__n);
    }
    if ((this->m_tcp_post_init_handler).super__Function_base._M_manager != (_Manager_type)0x0) {
      std::__weak_ptr<void,_(__gnu_cxx::_Lock_policy)2>::__weak_ptr
                (&_Stack_48,
                 &(this->m_connection_hdl).super___weak_ptr<void,_(__gnu_cxx::_Lock_policy)2>);
      std::function<void_(std::weak_ptr<void>)>::operator()
                (&this->m_tcp_post_init_handler,(weak_ptr<void> *)&_Stack_48);
      std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count(&_Stack_48._M_refcount);
    }
    std::function<void_(const_std::error_code_&)>::operator()(callback,ec);
  }
  return;
}

Assistant:

void handle_post_init(timer_ptr post_timer, init_handler callback,
        lib::error_code const & ec)
    {
        if (ec == transport::error::operation_aborted ||
            (post_timer && lib::asio::is_neg(post_timer->expires_from_now())))
        {
            m_alog->write(log::alevel::devel,"post_init cancelled");
            return;
        }

        if (post_timer) {
            post_timer->cancel();
        }

        if (m_alog->static_test(log::alevel::devel)) {
            m_alog->write(log::alevel::devel,"asio connection handle_post_init");
        }

        if (m_tcp_post_init_handler) {
            m_tcp_post_init_handler(m_connection_hdl);
        }

        callback(ec);
    }